

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TImage.cpp
# Opt level: O0

void __thiscall TUPU::TImage::setPath(TImage *this,string *filepath)

{
  string *in_RSI;
  long in_RDI;
  
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),in_RSI);
  std::__cxx11::string::clear();
  free(*(void **)(in_RDI + 0x90));
  *(undefined8 *)(in_RDI + 0x98) = 0;
  std::__cxx11::string::clear();
  return;
}

Assistant:

void TImage::setPath(const string & filepath)
{
    m_path = filepath;
    m_url.clear();
    std::free(m_buffer);
    m_len = 0;
    m_filename.clear();
}